

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void interactive(ChaiScript_Basic *chai)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_102;
  allocator<char> local_101 [9];
  Boxed_Value val;
  Exception_Handler local_e8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string input;
  string local_50;
  
  using_history();
  do {
    get_next_command_abi_cxx11_();
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"__EVAL__",(allocator<char> *)&local_50);
    chaiscript::ChaiScript_Basic::eval
              ((ChaiScript_Basic *)&val,(string *)chai,(Exception_Handler *)&input,&local_d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
    local_b0._M_dataplus._M_p = &void::typeinfo;
    local_b0._M_string_length = (size_type)&void::typeinfo;
    local_b0.field_2._M_allocated_capacity._0_4_ = 8;
    bVar1 = chaiscript::Type_Info::bare_equal
                      (&(val.m_data.
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)&local_b0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"to_string",local_101);
      local_e8.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_e8.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"__EVAL__",&local_102);
      chaiscript::ChaiScript_Basic::
      eval<std::function<std::__cxx11::string(chaiscript::Boxed_Value_const&)>>
                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
                  *)&local_d8,chai,&local_50,&local_e8,&local_90);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
      ::operator()(&local_b0,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
                    *)&local_d8,&val);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_b0);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string((string *)&local_b0);
      std::_Function_base::~_Function_base((_Function_base *)&local_d8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_e8.
                  super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&val.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&input);
  } while( true );
}

Assistant:

void interactive(chaiscript::ChaiScript_Basic &chai) {
  using_history();

  for (;;) {
    std::string input = get_next_command();
    try {
      // evaluate input
      chaiscript::Boxed_Value val = chai.eval(input);

      // Then, we try to print the result of the evaluation to the user
      if (!val.get_type_info().bare_equal(chaiscript::user_type<void>())) {
        try {
          std::cout << chai.eval<std::function<std::string(const chaiscript::Boxed_Value &bv)>>("to_string")(val) << '\n';
        } catch (...) {
        } // If we can't, do nothing
      }
    } catch (const chaiscript::exception::eval_error &ee) {
      std::cout << ee.what();
      if (!ee.call_stack.empty()) {
        std::cout << "during evaluation at (" << ee.call_stack[0].start().line << ", " << ee.call_stack[0].start().column << ")";
      }
      std::cout << '\n';
    } catch (const std::exception &e) {
      std::cout << e.what();
      std::cout << '\n';
    }
  }
}